

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O3

int get_length(char *file,int *byterev)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  uint uVar3;
  char *__format;
  stat statbuf;
  uint local_b4;
  stat local_b0;
  
  *byterev = 0;
  iVar1 = stat(file,&local_b0);
  if (iVar1 < 0) {
    __format = "stat_retry(%s) failed\n";
LAB_0010479e:
    printf(__format,file);
    return -1;
  }
  __stream = fopen(file,"rb");
  if (__stream == (FILE *)0x0) {
    __format = "fopen(%s,rb) failed\n";
    goto LAB_0010479e;
  }
  sVar2 = fread(&local_b4,4,1,__stream);
  if (sVar2 != 1) goto LAB_00104807;
  uVar3 = local_b4;
  if ((long)(int)local_b4 * 4 + 4U == local_b0.st_size) {
LAB_001047c5:
    if (-1 < (int)uVar3) {
      fclose(__stream);
      return uVar3;
    }
    printf("Header size field: %d\n",(ulong)uVar3);
  }
  else {
    uVar3 = local_b4 >> 0x18 | (local_b4 & 0xff0000) >> 8 | (local_b4 & 0xff00) << 8 |
            local_b4 << 0x18;
    if ((long)(int)uVar3 * 4 + 4U == local_b0.st_size) {
      *byterev = 1;
      goto LAB_001047c5;
    }
    printf("Header size field: %d(%08x); filesize: %d(%08x)\n",(ulong)local_b4,(long)(int)local_b4,
           local_b0.st_size,local_b0.st_size & 0xffffffff);
  }
  fflush(_stdout);
LAB_00104807:
  fclose(__stream);
  return -1;
}

Assistant:

int get_length(char *file,
               int *byterev)
{
  FILE            *fp;
  int             length;
  int             n;
  struct stat statbuf;

  *byterev = 0;
  if (stat(file, &statbuf) < 0) {
      printf("stat_retry(%s) failed\n", file);
      return -1;
  }
  if ((fp = fopen(file, "rb")) == NULL) {
      printf("fopen(%s,rb) failed\n", file);
      return -1;
  }

  /* Read #floats in header */
  if (fread(&length, sizeof(int), 1, fp) != 1) {
      fclose (fp);
      return -1;
  }

  /* Check if length matches file size */
  if ((length*sizeof(float) + 4) != statbuf.st_size) {
      n = length;
      MYSWAP_INT(&n);

      if ((n*sizeof(float) + 4) != statbuf.st_size) {
          printf("Header size field: %d(%08x); filesize: %d(%08x)\n",
                  length, length, (int)statbuf.st_size, (int)statbuf.st_size);
          fflush(stdout);
          fclose (fp);
          return -1;
      }

      length = n;
      *byterev = 1;
  }
  if (length < 0) {
      printf("Header size field: %d\n",  length); fflush(stdout);
      fclose (fp);
      return -1;
  }
  fclose(fp);
  return length;
}